

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O3

int outfile(char *filename,int rgb_dir,int vdir,int x,int y,int comp,int expand_mono,void *data,
           int alpha,int pad,char *fmt,...)

{
  uchar uVar1;
  long lVar2;
  char in_AL;
  byte bVar3;
  uint uVar4;
  FILE *__s;
  undefined2 *puVar5;
  byte *pbVar6;
  undefined4 *puVar7;
  long lVar8;
  long lVar9;
  size_t __size;
  void *pvVar10;
  uchar *puVar11;
  ulong uVar12;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_158 [48];
  undefined8 local_128;
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  long local_a0;
  ulong local_98;
  long local_90;
  long local_88;
  ulong local_80;
  void *local_78;
  uint local_6c;
  ulong local_68;
  va_list v;
  undefined4 local_3c;
  uchar local_36 [2];
  uchar b [2];
  uchar px [3];
  
  if (in_AL != '\0') {
    local_128 = in_XMM0_Qa;
    local_118 = in_XMM1_Qa;
    local_108 = in_XMM2_Qa;
    local_f8 = in_XMM3_Qa;
    local_e8 = in_XMM4_Qa;
    local_d8 = in_XMM5_Qa;
    local_c8 = in_XMM6_Qa;
    local_b8 = in_XMM7_Qa;
  }
  if ((y | x) < 0) {
    uVar4 = 0;
  }
  else {
    local_6c = x;
    __s = fopen(filename,"wb");
    if (__s != (FILE *)0x0) {
      v[0].overflow_arg_area = local_158;
      v[0]._0_8_ = &stack0x00000030;
      local_68 = 0x3000000030;
      bVar3 = *fmt;
      if (bVar3 != 0) {
        do {
          fmt = (char *)((byte *)fmt + 1);
          if (bVar3 < 0x32) {
            if (bVar3 != 0x20) {
              if (bVar3 != 0x31) {
LAB_00107f34:
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_image_write.h"
                              ,0x92,"void writefv(FILE *, const char *, __va_list_tag *)");
              }
              uVar12 = local_68 & 0xffffffff;
              if (uVar12 < 0x29) {
                local_68 = CONCAT44(local_68._4_4_,(int)local_68 + 8);
                pbVar6 = (byte *)(uVar12 + (long)v[0].overflow_arg_area);
              }
              else {
                pbVar6 = (byte *)v[0]._0_8_;
                v[0]._0_8_ = v[0]._0_8_ + 8;
              }
              fputc((uint)*pbVar6,__s);
            }
          }
          else {
            if (bVar3 == 0x32) {
              uVar12 = local_68 & 0xffffffff;
              if (uVar12 < 0x29) {
                local_68 = CONCAT44(local_68._4_4_,(int)local_68 + 8);
                puVar5 = (undefined2 *)(uVar12 + (long)v[0].overflow_arg_area);
              }
              else {
                puVar5 = (undefined2 *)v[0]._0_8_;
                v[0]._0_8_ = v[0]._0_8_ + 8;
              }
              local_3c = CONCAT22(local_3c._2_2_,*puVar5);
              __size = 2;
            }
            else {
              if (bVar3 != 0x34) goto LAB_00107f34;
              uVar12 = local_68 & 0xffffffff;
              if (uVar12 < 0x29) {
                local_68 = CONCAT44(local_68._4_4_,(int)local_68 + 8);
                puVar7 = (undefined4 *)(uVar12 + (long)v[0].overflow_arg_area);
              }
              else {
                puVar7 = (undefined4 *)v[0]._0_8_;
                v[0]._0_8_ = v[0]._0_8_ + 8;
              }
              local_3c = *puVar7;
              __size = 4;
            }
            fwrite(&local_3c,__size,1,__s);
          }
          bVar3 = *fmt;
        } while (bVar3 != 0);
      }
      local_3c = 0;
      if (0 < y) {
        lVar9 = (long)comp;
        local_80 = (ulong)(uint)y;
        local_88 = (long)(int)local_6c;
        local_98 = (ulong)local_6c;
        local_78 = (void *)((local_80 - 1) * lVar9 * local_88 + (long)data);
        local_90 = -(lVar9 * local_88);
        do {
          local_80 = local_80 - 1;
          if (0 < (int)local_6c) {
            local_a0 = local_80 * local_88;
            uVar12 = 0;
            pvVar10 = local_78;
            do {
              puVar11 = (uchar *)((uVar12 + local_a0) * lVar9 + (long)data);
              switch(comp) {
              case 1:
                uVar1 = *puVar11;
LAB_00107e98:
                fputc((int)(char)uVar1,__s);
                break;
              case 2:
                uVar1 = *puVar11;
                if (expand_mono == 0) goto LAB_00107e98;
                goto LAB_00107e2d;
              case 4:
                if (alpha == 0) {
                  bVar3 = puVar11[3];
                  lVar8 = 0;
                  do {
                    lVar2 = (long)(int)(((uint)*(byte *)((long)pvVar10 + lVar8) -
                                        (uint)(byte)(&DAT_001111c4)[lVar8]) * (uint)bVar3) *
                            0x80808081;
                    local_36[lVar8] =
                         ((char)(uint)((ulong)lVar2 >> 0x27) - (char)(lVar2 >> 0x3f)) +
                         (&DAT_001111c4)[lVar8];
                    lVar8 = lVar8 + 1;
                    uVar1 = b[0];
                  } while (lVar8 != 3);
                  goto LAB_00107e2d;
                }
              case 3:
                uVar1 = puVar11[2];
LAB_00107e2d:
                b[1] = uVar1;
                fwrite(b + 1,3,1,__s);
              }
              if (0 < alpha) {
                fputc((int)(char)puVar11[lVar9 + -1],__s);
              }
              uVar12 = uVar12 + 1;
              pvVar10 = (void *)((long)pvVar10 + lVar9);
            } while (uVar12 != local_98);
          }
          fwrite(&local_3c,(ulong)(uint)pad,1,__s);
          local_78 = (void *)((long)local_78 + local_90);
        } while (local_80 != 0);
      }
      fclose(__s);
    }
    uVar4 = (uint)(__s != (FILE *)0x0);
  }
  return uVar4;
}

Assistant:

static int outfile(char const *filename, int rgb_dir, int vdir, int x, int y, int comp, int expand_mono, void *data, int alpha, int pad, const char *fmt, ...)
{
   FILE *f;
   if (y < 0 || x < 0) return 0;
   f = fopen(filename, "wb");
   if (f) {
      va_list v;
      va_start(v, fmt);
      writefv(f, fmt, v);
      va_end(v);
      write_pixels(f,rgb_dir,vdir,x,y,comp,data,alpha,pad,expand_mono);
      fclose(f);
   }
   return f != NULL;
}